

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O2

void EpdGetString(EpDouble *epd,char *str)

{
  EpTypeUnion EVar1;
  uint uVar2;
  char *pcVar3;
  char *__format;
  EpType val;
  uint local_24;
  double value;
  
  EVar1 = epd->type;
  uVar2 = EVar1._4_4_ >> 0x14;
  if (((ulong)EVar1 & 0xfffffffffffff) == 0x8000000000000 && 0xffe < uVar2) {
    builtin_strncpy(str,"NaN",4);
  }
  else {
    if (((ulong)EVar1 & 0x7fffffffffffffff) != 0x7ff0000000000000) {
      uVar2 = uVar2 & 0x7ff;
      if ((uVar2 != 0) && (uVar2 != 0x3ff)) {
        __assert_fail("epd->type.bits.exponent == EPD_MAX_BIN || epd->type.bits.exponent == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/epd/epd.c"
                      ,0x99,"void EpdGetString(EpDouble *, char *)");
      }
      EpdGetValueAndDecimalExponent(epd,&value,(int *)&local_24);
      sprintf(str,"%e",value);
      pcVar3 = strchr(str,0x65);
      if ((int)local_24 < 0) {
        if (local_24 < 0xfffffff7) {
          __format = "-%d";
          local_24 = -local_24;
        }
        else {
          __format = "-0%d";
          local_24 = -local_24;
        }
      }
      else if (local_24 < 10) {
        __format = "+0%d";
      }
      else {
        __format = "+%d";
      }
      sprintf(pcVar3 + 1,__format,(ulong)local_24);
      return;
    }
    if ((long)EVar1 < 0) {
      builtin_strncpy(str,"-Inf",5);
    }
    else {
      builtin_strncpy(str,"Inf",4);
    }
  }
  return;
}

Assistant:

void
EpdGetString(EpDouble *epd, char *str)
{
  double        value;
  int           exponent;
  char          *pos;

  if (IsNanDouble(epd->type.value)) {
    sprintf(str, "NaN");
    return;
  } else if (IsInfDouble(epd->type.value)) {
    if (epd->type.bits.sign == 1)
      sprintf(str, "-Inf");
    else
      sprintf(str, "Inf");
    return;
  }

  assert(epd->type.bits.exponent == EPD_MAX_BIN ||
         epd->type.bits.exponent == 0);

  EpdGetValueAndDecimalExponent(epd, &value, &exponent);
  sprintf(str, "%e", value);
  pos = strstr(str, "e");
  if (exponent >= 0) {
    if (exponent < 10)
      sprintf(pos + 1, "+0%d", exponent);
    else
      sprintf(pos + 1, "+%d", exponent);
  } else {
    exponent *= -1;
    if (exponent < 10)
      sprintf(pos + 1, "-0%d", exponent);
    else
      sprintf(pos + 1, "-%d", exponent);
  }
}